

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O1

void __thiscall BamTools::Internal::BamHttp::BamHttp(BamHttp *this,string *url)

{
  TcpSocket *this_00;
  
  (this->super_IBamIODevice).m_mode = NotOpen;
  (this->super_IBamIODevice).m_errorString._M_dataplus._M_p =
       (pointer)&(this->super_IBamIODevice).m_errorString.field_2;
  (this->super_IBamIODevice).m_errorString._M_string_length = 0;
  (this->super_IBamIODevice).m_errorString.field_2._M_local_buf[0] = '\0';
  (this->super_IBamIODevice)._vptr_IBamIODevice = (_func_int **)&PTR__BamHttp_0017ab08;
  this_00 = (TcpSocket *)operator_new(0x120);
  TcpSocket::TcpSocket(this_00);
  this->m_socket = this_00;
  (this->m_hostname)._M_dataplus._M_p = (pointer)&(this->m_hostname).field_2;
  (this->m_hostname)._M_string_length = 0;
  (this->m_hostname).field_2._M_local_buf[0] = '\0';
  (this->m_port)._M_dataplus._M_p = (pointer)&(this->m_port).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_port,HTTP_PORT_abi_cxx11_,DAT_0017b800 + HTTP_PORT_abi_cxx11_);
  (this->m_filename)._M_dataplus._M_p = (pointer)&(this->m_filename).field_2;
  (this->m_filename)._M_string_length = 0;
  (this->m_filename).field_2._M_local_buf[0] = '\0';
  this->m_request = (HttpRequestHeader *)0x0;
  this->m_response = (HttpResponseHeader *)0x0;
  this->m_isUrlParsed = false;
  *(undefined4 *)&this->m_filePosition = 0xffffffff;
  *(undefined4 *)((long)&this->m_filePosition + 4) = 0xffffffff;
  *(undefined4 *)&this->m_fileEndPosition = 0xffffffff;
  *(undefined4 *)((long)&this->m_fileEndPosition + 4) = 0xffffffff;
  this->m_rangeEndPosition = -1;
  ParseUrl(this,url);
  return;
}

Assistant:

BamHttp::BamHttp(const std::string& url)
    : IBamIODevice()
    , m_socket(new TcpSocket)
    , m_port(HTTP_PORT)
    , m_request(0)
    , m_response(0)
    , m_isUrlParsed(false)
    , m_filePosition(-1)
    , m_fileEndPosition(-1)
    , m_rangeEndPosition(-1)
{
    ParseUrl(url);
}